

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O2

size_t __thiscall wasm::anon_unknown_0::RecGroupHasher::hash(RecGroupHasher *this,Type type)

{
  pointer pTVar1;
  BasicType BVar2;
  size_t sVar3;
  HeapType type_00;
  Tuple *pTVar4;
  ulong uVar5;
  const_iterator __end2;
  const_iterator __begin2;
  pointer pTVar6;
  ulong uVar7;
  Type local_38;
  Type type_local;
  
  uVar5 = (ulong)(type.id < 7);
  local_38.id = type.id;
  if (type.id < 7) {
    BVar2 = wasm::Type::getBasic(&local_38);
    sVar3 = (ulong)BVar2 + 0x9e3779b97f4a8c15 ^ uVar5;
  }
  else {
    uVar7 = (ulong)((uint)type.id & 1);
    uVar5 = uVar7 + 0x9e3779b97f4a7c15 ^ uVar5;
    if (uVar7 == 0) {
      uVar5 = ((ulong)((uint)type.id >> 1 & 1) | 0xa81af155173f23d6) + uVar5 * 0x1000 ^ uVar5;
      type_00 = wasm::Type::getHeapType(&local_38);
      sVar3 = hash(this,type_00);
      sVar3 = (uVar5 >> 4) + sVar3 + uVar5 * 0x1000 + -0x61c8864680b583eb ^ uVar5;
    }
    else {
      pTVar4 = wasm::Type::getTuple(&local_38);
      pTVar6 = (pTVar4->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar1 = (pTVar4->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar7 = (long)pTVar1 - (long)pTVar6 >> 3;
      for (; pTVar6 != pTVar1; pTVar6 = pTVar6 + 1) {
        sVar3 = hash(this,(Type)pTVar6->id);
        uVar7 = uVar7 ^ uVar7 * 0x1000 + -0x61c8864680b583eb + (uVar7 >> 4) + sVar3;
      }
      sVar3 = uVar5 * 0x1000 + -0x57e50eaae8c0dc2a + uVar7 ^ uVar5;
    }
  }
  return sVar3;
}

Assistant:

size_t hash(Type type) {
    size_t digest = wasm::hash(type.isBasic());
    if (type.isBasic()) {
      wasm::rehash(digest, type.getBasic());
      return digest;
    }
    wasm::rehash(digest, type.isTuple());
    if (type.isTuple()) {
      hash_combine(digest, hash(type.getTuple()));
      return digest;
    }
    assert(type.isRef());
    wasm::rehash(digest, type.isNullable());
    hash_combine(digest, hash(type.getHeapType()));
    return digest;
  }